

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Option<Catch::TestCaseInfo>::reset(Option<Catch::TestCaseInfo> *this)

{
  Option<Catch::TestCaseInfo> *this_local;
  
  if (this->nullableValue != (TestCaseInfo *)0x0) {
    TestCaseInfo::~TestCaseInfo(this->nullableValue);
  }
  this->nullableValue = (TestCaseInfo *)0x0;
  return;
}

Assistant:

void reset() {
            if( nullableValue )
                nullableValue->~T();
            nullableValue = nullptr;
        }